

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IndexFlush(Fts5Index *p)

{
  int *pRc;
  Fts5HashEntry *pTerm;
  uchar *p_00;
  int iVar1;
  int iVar2;
  Fts5Hash *p_01;
  Fts5HashEntry *p_02;
  Fts5StructureSegment *pFVar3;
  bool bVar4;
  undefined4 uVar5;
  uint uVar6;
  Fts5Structure *pFVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *__src;
  u64 uVar14;
  Fts5Config *pFVar15;
  int iVar16;
  u64 uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  u64 in_R8;
  Fts5Structure *pStruct;
  uint uVar21;
  int iVar22;
  long lVar24;
  int iVar25;
  Fts5HashEntry *p_1;
  long in_FS_OFFSET;
  Fts5SegWriter writer;
  int pgnoLast;
  u64 local_140;
  Fts5Structure *local_128;
  u64 local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  u8 *local_a8;
  undefined1 *puStack_a0;
  u8 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  Fts5DlidxWriter *pFStack_70;
  u8 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  int local_4c;
  Fts5Structure *local_48;
  uint local_3c;
  long local_38;
  ulong uVar23;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->flushRc != 0) {
    p->rc = p->flushRc;
    goto LAB_001e4e74;
  }
  if ((p->nPendingData == 0) && (p->nContentlessDelete == 0)) goto LAB_001e4e74;
  p_01 = p->pHash;
  local_4c = 0;
  local_128 = fts5StructureRead(p);
  local_48 = local_128;
  if (p->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(p->pStruct);
    p->pStruct = (Fts5Structure *)0x0;
  }
  iVar16 = 0;
  if ((p_01->nEntry != 0) && (iVar9 = fts5AllocateSegid(p,local_128), iVar9 != 0)) {
    pFVar15 = p->pConfig;
    iVar16 = pFVar15->eDetail;
    iVar1 = pFVar15->pgsz;
    iVar2 = pFVar15->bSecureDelete;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pFStack_70 = (Fts5DlidxWriter *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fts5WriteInit(p,(Fts5SegWriter *)local_c8,iVar9);
    iVar20 = (int)in_R8;
    pRc = &p->rc;
    if (p->rc == 0) {
      iVar10 = sqlite3Fts5HashScanInit(p_01,(char *)0x0,0);
      iVar20 = (int)in_R8;
      *pRc = iVar10;
      if (iVar10 == 0) {
        p_02 = p_01->pScan;
        while (p_02 != (Fts5HashEntry *)0x0) {
          pTerm = p_02 + 1;
          iVar10 = p_02->nKey;
          fts5HashAddPoslistSize(p_01,p_02,(Fts5HashEntry *)0x0);
          iVar11 = (p_02->nData - iVar10) + -0x30;
          __src = (void *)((long)&p_02[1].pHashNext + (long)iVar10);
          if (iVar2 == 0) {
            fts5WriteAppendTerm(p,(Fts5SegWriter *)local_c8,iVar10,(u8 *)pTerm);
            iVar20 = (int)in_R8;
            if (p->rc != 0) break;
            iVar12 = 0;
            if (iVar1 <= local_b8._8_4_ + iVar11 + (int)puStack_a0) goto LAB_001e47b0;
            memcpy((undefined1 *)((long)(int)local_b8._8_4_ + local_b8._0_8_),__src,(long)iVar11);
            local_b8._8_4_ = local_b8._8_4_ + iVar11;
            iVar12 = *pRc;
          }
          else {
            iVar12 = *pRc;
LAB_001e47b0:
            if ((iVar12 == 0) && (0 < iVar11)) {
              uVar14 = 0;
              uVar17 = 0;
              local_140 = 0;
              bVar4 = iVar2 == 0;
              do {
                iVar20 = (int)in_R8;
                local_d0 = 0;
                bVar8 = sqlite3Fts5GetVarint((uchar *)((long)__src + (long)(int)uVar14),&local_d0);
                uVar21 = (int)uVar14 + (uint)bVar8;
                uVar23 = (ulong)uVar21;
                local_140 = local_140 + local_d0;
                if (iVar2 == 0) goto LAB_001e48b1;
                in_R8 = local_140;
                if (iVar16 == 1) {
                  if (((int)uVar21 < iVar11) && (*(char *)((long)__src + (long)(int)uVar21) == '\0')
                     ) {
                    iVar12 = fts5FlushSecureDelete(p,local_128,(char *)pTerm,iVar10,local_140);
                    iVar20 = (int)in_R8;
                    if (iVar12 != 0) goto LAB_001e48b1;
                    uVar14 = (long)(int)uVar21 + 1;
                    if (((int)uVar14 < iVar11) && (*(char *)((long)__src + uVar14) == '\0')) {
                      iVar11 = 0;
                      uVar23 = (ulong)(uVar21 + 2);
                      goto LAB_001e48b1;
                    }
                  }
                  else {
LAB_001e48b1:
                    in_R8 = uVar23;
                    if (*pRc == 0 && !bVar4) {
                      fts5WriteAppendTerm(p,(Fts5SegWriter *)local_c8,iVar10,(u8 *)pTerm);
                      bVar4 = true;
                    }
                    uVar5 = local_b8._8_4_;
                    if (uStack_80._1_1_ == '\0') {
                      iVar12 = sqlite3Fts5PutVarint
                                         ((uchar *)((long)(int)local_b8._8_4_ + local_b8._0_8_),
                                          local_140 - uVar17);
                      local_b8._8_4_ = local_b8._8_4_ + iVar12;
                    }
                    else {
                      *(ushort *)local_b8._0_8_ = local_b8._8_2_ << 8 | (ushort)local_b8._8_2_ >> 8;
                      iVar12 = sqlite3Fts5PutVarint
                                         ((uchar *)((long)(int)uVar5 + local_b8._0_8_),local_140);
                      local_b8._8_4_ = local_b8._8_4_ + iVar12;
                      uStack_80._0_2_ = (ushort)(byte)uStack_80;
                      fts5WriteDlidxAppend(p,(Fts5SegWriter *)local_c8,local_140);
                    }
                    if (*pRc != 0) goto LAB_001e4c61;
                    iVar20 = (int)in_R8;
                    uVar17 = local_140;
                    if (iVar16 != 1) {
                      bVar8 = *(byte *)((long)__src + (long)iVar20);
                      local_3c = (uint)bVar8;
                      iVar12 = 1;
                      if ((char)bVar8 < '\0') {
                        iVar12 = sqlite3Fts5GetVarint32
                                           ((uchar *)((long)iVar20 + (long)__src),&local_3c);
                      }
                      iVar25 = (int)local_3c / 2;
                      if ((iVar2 == 0) || ((local_3c & 1) == 0)) {
                        iVar25 = iVar12 + iVar25;
                      }
                      else {
                        sqlite3Fts5BufferAppendVarint(pRc,(Fts5Buffer *)local_b8,(long)iVar25 * 2);
                        in_R8 = (u64)(uint)(iVar12 + iVar20);
                      }
                      iVar20 = (int)in_R8;
                      lVar24 = (long)iVar20;
                      if (iVar1 < local_b8._8_4_ + iVar25 + (int)puStack_a0) {
                        iVar12 = 0;
                        do {
                          if (*pRc != 0) break;
                          lVar19 = (long)(int)local_b8._8_4_;
                          iVar22 = iVar1 - ((int)puStack_a0 + local_b8._8_4_);
                          uVar21 = iVar25 - iVar12;
                          if (iVar22 < (int)uVar21) {
                            p_00 = (uchar *)((long)__src + iVar12 + lVar24);
                            uVar21 = sqlite3Fts5GetVarint32(p_00,&local_3c);
                            if ((int)uVar21 < iVar22) {
                              uVar6 = uVar21;
                              do {
                                uVar21 = uVar6;
                                iVar13 = sqlite3Fts5GetVarint32(p_00 + uVar21,&local_3c);
                                uVar6 = iVar13 + uVar21;
                              } while ((int)(iVar13 + uVar21) <= iVar22);
                            }
                          }
                          memcpy((undefined1 *)(lVar19 + local_b8._0_8_),
                                 (void *)((long)__src + iVar12 + lVar24),(long)(int)uVar21);
                          iVar22 = uVar21 + local_b8._8_4_;
                          local_b8._8_4_ = iVar22;
                          if (iVar1 <= iVar22 + (int)puStack_a0) {
                            fts5WriteFlushLeaf(p,(Fts5SegWriter *)local_c8);
                          }
                          iVar12 = iVar12 + uVar21;
                        } while (iVar12 < iVar25);
                      }
                      else {
                        memcpy((undefined1 *)((long)(int)local_b8._8_4_ + local_b8._0_8_),
                               (void *)(lVar24 + (long)__src),(long)iVar25);
                        local_b8._8_4_ = local_b8._8_4_ + iVar25;
                      }
                      uVar21 = iVar25 + iVar20;
                      goto LAB_001e4b84;
                    }
                    uVar14 = in_R8;
                    if ((iVar20 < iVar11) && (*(char *)((long)__src + (long)iVar20) == '\0')) {
                      uVar5 = local_b8._8_4_;
                      lVar24 = (long)(int)local_b8._8_4_;
                      iVar12 = local_b8._8_4_ + 1;
                      local_b8._8_4_ = iVar12;
                      *(undefined1 *)(local_b8._0_8_ + lVar24) = 0;
                      uVar14 = (long)iVar20 + 1;
                      if (((int)uVar14 < iVar11) && (*(char *)((long)__src + uVar14) == '\0')) {
                        local_b8._8_4_ = uVar5 + 2;
                        *(undefined1 *)(local_b8._0_8_ + (long)iVar12) = 0;
                        in_R8 = (u64)(iVar20 + 2);
                        uVar14 = in_R8;
                      }
                    }
                    if (iVar1 <= (int)puStack_a0 + local_b8._8_4_) {
                      fts5WriteFlushLeaf(p,(Fts5SegWriter *)local_c8);
                    }
                  }
                }
                else {
                  if ((*(byte *)((long)__src + (long)(int)uVar21) & 1) == 0) goto LAB_001e48b1;
                  iVar12 = fts5FlushSecureDelete(p,local_128,(char *)pTerm,iVar10,local_140);
                  iVar20 = (int)in_R8;
                  if ((iVar12 != 0) ||
                     ((*pRc == 0 && (*(char *)((long)__src + (long)(int)uVar21) != '\x01'))))
                  goto LAB_001e48b1;
                  uVar21 = uVar21 + 1;
LAB_001e4b84:
                  uVar14 = (u64)uVar21;
                }
                iVar12 = *pRc;
              } while ((iVar12 == 0) && ((int)uVar14 < iVar11));
            }
          }
          iVar20 = (int)in_R8;
          if (iVar12 != 0) break;
          p_02 = p_01->pScan->pScanNext;
          p_01->pScan = p_02;
        }
      }
    }
LAB_001e4c61:
    fts5WriteFinish(p,(Fts5SegWriter *)local_c8,&local_4c);
    iVar16 = local_4c;
    if (0 < local_4c) {
      if (local_128->nLevel == 0) {
        fts5StructureAddLevel(pRc,&local_48);
        local_128 = local_48;
      }
      fts5StructureExtendLevel(pRc,local_128,0,0,iVar20);
      if (*pRc == 0) {
        pFVar3 = local_128->aLevel[0].aSeg;
        iVar1 = local_128->aLevel[0].nSeg;
        local_128->aLevel[0].nSeg = iVar1 + 1;
        pFVar3[iVar1].iSegid = iVar9;
        pFVar3[iVar1].pgnoFirst = 1;
        pFVar3[iVar1].pgnoLast = iVar16;
        uVar17 = local_128->nOriginCntr;
        if (uVar17 != 0) {
          pFVar3[iVar1].iOrigin1 = uVar17;
          pFVar3[iVar1].iOrigin2 = uVar17;
          pFVar3[iVar1].nEntry = (long)p->nPendingRow;
          local_128->nOriginCntr = uVar17 + 1;
        }
        local_128->nSegment = local_128->nSegment + 1;
      }
      fts5StructurePromote(p,0,local_128);
    }
  }
  pFVar15 = p->pConfig;
  if ((p->rc == 0) && (iVar9 = pFVar15->nAutomerge, 0 < iVar9)) {
    if (local_128 != (Fts5Structure *)0x0) {
      uVar23 = local_128->nWriteCounter;
      uVar18 = (long)iVar16 + (long)p->nContentlessDelete + uVar23;
      iVar16 = p->nWorkUnit;
      local_128->nWriteCounter = uVar18;
      fts5IndexMerge(p,&local_48,
                     ((int)(uVar18 / (ulong)(long)iVar16) - (int)(uVar23 / (ulong)(long)iVar16)) *
                     iVar16 * local_128->nLevel,iVar9);
      pFVar15 = p->pConfig;
      local_128 = local_48;
      goto LAB_001e4d36;
    }
LAB_001e4e2a:
    local_128 = (Fts5Structure *)0x0;
    pFVar7 = local_48;
  }
  else {
LAB_001e4d36:
    iVar16 = pFVar15->nCrisisMerge;
    local_c8._0_8_ = local_128;
    if (local_128 == (Fts5Structure *)0x0) goto LAB_001e4e2a;
    pFVar7 = local_48;
    if ((0 < local_128->nLevel) && (pFVar7 = local_128, p->rc == 0)) {
      iVar9 = 1;
      lVar24 = 0x24;
      do {
        pFVar7 = local_128;
        if (*(int *)((long)&((Fts5Structure *)(local_128->aLevel + -2))->nRef + lVar24) < iVar16)
        break;
        fts5IndexMergeLevel(p,(Fts5Structure **)local_c8,iVar9 + -1,(int *)0x0);
        local_128 = (Fts5Structure *)local_c8._0_8_;
        fts5StructurePromote(p,iVar9,(Fts5Structure *)local_c8._0_8_);
        iVar9 = iVar9 + 1;
        lVar24 = lVar24 + 0x10;
        pFVar7 = local_128;
      } while (p->rc == 0);
    }
  }
  local_48 = pFVar7;
  fts5StructureWrite(p,local_128);
  fts5StructureRelease(local_128);
  if (p->rc == 0) {
    sqlite3Fts5HashClear(p->pHash);
    p->nPendingData = 0;
    p->nContentlessDelete = 0;
    p->nPendingRow = 0;
  }
  else if ((p->nPendingData != 0) || (p->nContentlessDelete != 0)) {
    p->flushRc = p->rc;
  }
LAB_001e4e74:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->flushRc ){
    p->rc = p->flushRc;
    return;
  }
  if( p->nPendingData || p->nContentlessDelete ){
    assert( p->pHash );
    fts5FlushOneHash(p);
    if( p->rc==SQLITE_OK ){
      sqlite3Fts5HashClear(p->pHash);
      p->nPendingData = 0;
      p->nPendingRow = 0;
      p->nContentlessDelete = 0;
    }else if( p->nPendingData || p->nContentlessDelete ){
      p->flushRc = p->rc;
    }
  }
}